

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::selectConstant
          (CodegenVisitor *this,SQInteger target,SQObject *constant)

{
  SQObjectType SVar1;
  uint6 uVar2;
  SQInteger SVar3;
  SQFuncState *this_00;
  SQInstruction local_18;
  
  SVar1 = constant->_type;
  if (SVar1 == OT_BOOL) {
    this_00 = this->_fs;
    local_18._arg0 = (uchar)target;
    local_18._0_5_ = 0x2000000000;
    uVar2 = CONCAT24(local_18._4_2_,(constant->_unVal).fFloat);
  }
  else {
    if (SVar1 == OT_FLOAT) {
      EmitLoadConstFloat(this,(constant->_unVal).fFloat,target);
      return;
    }
    if (SVar1 == OT_INTEGER) {
      EmitLoadConstInt(this,(constant->_unVal).nInteger,target);
      return;
    }
    this_00 = this->_fs;
    SVar3 = SQFuncState::GetConstant(this_00,constant,0x7fffffff);
    local_18._arg0 = (uchar)target;
    local_18._0_5_ = 0x100000000;
    uVar2 = CONCAT24(local_18._4_2_,(int)SVar3);
  }
  local_18._arg2 = '\0';
  local_18._arg3 = '\0';
  local_18.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)(int)uVar2;
  local_18.op = (char)(uVar2 >> 0x20);
  local_18._arg0 = (char)(uVar2 >> 0x28);
  SQFuncState::AddInstruction(this_00,&local_18);
  return;
}

Assistant:

void CodegenVisitor::selectConstant(SQInteger target, const SQObject &constant) {
    SQObjectType ctype = sq_type(constant);
    switch (ctype) {
    case OT_INTEGER: EmitLoadConstInt(_integer(constant), target); break;
    case OT_FLOAT: EmitLoadConstFloat(_float(constant), target); break;
    case OT_BOOL: _fs->AddInstruction(_OP_LOADBOOL, target, _integer(constant)); break;
    default: _fs->AddInstruction(_OP_LOAD, target, _fs->GetConstant(constant)); break;
    }
}